

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrLocalizationMapML *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  invalid_argument *piVar4;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  string next_prefix;
  string maptype_prefix;
  string type_prefix;
  string mapuuid_prefix;
  string name_prefix;
  string local_b0;
  undefined1 local_90 [32];
  string local_70;
  string local_50;
  
  PointerToHexString<XrLocalizationMapML>((XrLocalizationMapML *)next_prefix._M_dataplus._M_p);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&next_prefix);
  std::__cxx11::string::~string((string *)&next_prefix);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string(&next_prefix,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,&next_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
  }
  else {
    next_prefix.field_2._M_allocated_capacity = 0;
    next_prefix.field_2._8_8_ = 0;
    next_prefix._M_dataplus._M_p = (pointer)0x0;
    next_prefix._M_string_length = 0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&next_prefix);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,(char (*) [64])&next_prefix
              );
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_50,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_50,contents);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar2) {
    std::__cxx11::string::string((string *)&name_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&name_prefix);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,char_const(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [6])0x20fc54,&name_prefix,&value->name);
    std::__cxx11::string::string((string *)&mapuuid_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&mapuuid_prefix);
    std::__cxx11::string::string((string *)(local_90 + 0x20),(string *)&mapuuid_prefix);
    gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_90;
    std::__cxx11::string::string
              ((string *)gen_dispatch_table_00,"XrUuidEXT",(allocator *)&maptype_prefix);
    bVar2 = ApiDumpOutputXrStruct
                      (gen_dispatch_table_00,&value->mapUuid,(string *)(local_90 + 0x20),
                       (string *)local_90,false,contents);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)(local_90 + 0x20));
    if (bVar2) {
      std::__cxx11::string::string((string *)&maptype_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&maptype_prefix);
      std::__cxx11::to_string(&local_b0,value->mapType);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[24],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [24])"XrLocalizationMapTypeML",&maptype_prefix,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&maptype_prefix);
      std::__cxx11::string::~string((string *)&mapuuid_prefix);
      std::__cxx11::string::~string((string *)&name_prefix);
      std::__cxx11::string::~string((string *)&next_prefix);
      std::__cxx11::string::~string((string *)&type_prefix);
      return true;
    }
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Invalid Operation");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,"Invalid Operation");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrLocalizationMapML* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string name_prefix = prefix;
        name_prefix += "name";
        contents.emplace_back("char*", name_prefix, value->name);
        std::string mapuuid_prefix = prefix;
        mapuuid_prefix += "mapUuid";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->mapUuid, mapuuid_prefix, "XrUuidEXT", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string maptype_prefix = prefix;
        maptype_prefix += "mapType";
        contents.emplace_back("XrLocalizationMapTypeML", maptype_prefix, std::to_string(value->mapType));
        return true;
    } catch(...) {
    }
    return false;
}